

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messages.cpp
# Opt level: O3

string * common::FeeModeInfo(string *__return_storage_ptr__,
                            pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FeeEstimateMode>
                            *mode,string *default_info)

{
  FeeEstimateMode FVar1;
  long lVar2;
  char *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R8;
  long in_FS_OFFSET;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  FVar1 = mode->second;
  if (FVar1 == CONSERVATIVE) {
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
      this = 
      "%s estimates use a longer time horizon, making them\nless responsive to short-term drops in the prevailing fee market. This mode\npotentially returns a higher fee rate estimate.\n"
      ;
LAB_00673a5c:
      tinyformat::format<std::__cxx11::string>
                (__return_storage_ptr__,(tinyformat *)this,(char *)mode,default_info);
      return __return_storage_ptr__;
    }
  }
  else if (FVar1 == ECONOMICAL) {
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
      this = 
      "%s estimates use a shorter time horizon, making them more\nresponsive to short-term drops in the prevailing fee market. This mode\npotentially returns a lower fee rate estimate.\n"
      ;
      goto LAB_00673a5c;
    }
  }
  else {
    if (FVar1 != UNSET) {
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/common/messages.cpp"
                    ,0x47,
                    "std::string common::FeeModeInfo(const std::pair<std::string, FeeEstimateMode> &, std::string &)"
                   );
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
      tinyformat::format<std::__cxx11::string,std::__cxx11::string>
                (__return_storage_ptr__,(tinyformat *)"%s means no mode set (%s). \n",(char *)mode,
                 default_info,in_R8);
      return __return_storage_ptr__;
    }
  }
  __stack_chk_fail();
}

Assistant:

std::string FeeModeInfo(const std::pair<std::string, FeeEstimateMode>& mode, std::string& default_info)
{
    switch (mode.second) {
        case FeeEstimateMode::UNSET:
            return strprintf("%s means no mode set (%s). \n", mode.first, default_info);
        case FeeEstimateMode::ECONOMICAL:
            return strprintf("%s estimates use a shorter time horizon, making them more\n"
                   "responsive to short-term drops in the prevailing fee market. This mode\n"
                   "potentially returns a lower fee rate estimate.\n", mode.first);
        case FeeEstimateMode::CONSERVATIVE:
            return strprintf("%s estimates use a longer time horizon, making them\n"
                   "less responsive to short-term drops in the prevailing fee market. This mode\n"
                   "potentially returns a higher fee rate estimate.\n", mode.first);
        default:
            // Other modes apart from the ones handled are fee rate units; they should not be clarified.
            assert(false);
    }
}